

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_free(anm_archive_t *anm)

{
  uchar *puVar1;
  long *__ptr;
  undefined8 *__ptr_00;
  void *__ptr_01;
  list_node_t *plVar2;
  void **ppvVar3;
  list_node_t *list;
  list_node_t *plVar4;
  undefined8 *puVar5;
  
  puVar1 = anm->map;
  plVar2 = (list_node_t *)&anm->names;
  while (plVar2 = plVar2->next, plVar2 != (list_node_t *)0x0) {
    free(plVar2->data);
  }
  list_free_nodes(&anm->names);
  plVar2 = (list_node_t *)&anm->entries;
  do {
    plVar2 = plVar2->next;
    if (plVar2 == (list_node_t *)0x0) {
      list_free_nodes(&anm->entries);
      if (puVar1 != (uchar *)0x0) {
        file_munmap(anm->map,anm->map_size);
      }
      free(anm);
      return;
    }
    __ptr = (long *)plVar2->data;
    list = (list_node_t *)(__ptr + 4);
    list_free_nodes((list_t *)list);
    plVar4 = (list_node_t *)(__ptr + 6);
    while (plVar4 = plVar4->next, plVar4 != (list_node_t *)0x0) {
      __ptr_00 = (undefined8 *)plVar4->data;
      if (puVar1 == (uchar *)0x0) {
        free((void *)*__ptr_00);
LAB_00105d43:
        puVar5 = __ptr_00 + 1;
        while (puVar5 = (undefined8 *)*puVar5, puVar5 != (undefined8 *)0x0) {
          free((void *)puVar5[2]);
        }
      }
      else if (*(int *)(*__ptr + 0x28) == 0) goto LAB_00105d43;
      list_free_nodes((list_t *)(__ptr_00 + 1));
      free(__ptr_00);
    }
    list_free_nodes((list_t *)(__ptr + 6));
    __ptr_01 = (void *)*__ptr;
    if (puVar1 == (uchar *)0x0) {
      free(__ptr_01);
      free((void *)__ptr[1]);
      free((void *)__ptr[3]);
      ppvVar3 = (void **)(__ptr + 8);
      do {
        free(*ppvVar3);
        list = list->next;
        ppvVar3 = &list->data;
      } while (list != (list_node_t *)0x0);
    }
    else if (6 < *(uint *)((long)__ptr_01 + 0x28)) {
      free(__ptr_01);
    }
    free(__ptr);
  } while( true );
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        list_free_nodes(&entry->sprites);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }

        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}